

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall InitSocket::IpChangeThread(InitSocket *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int __nfds;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  int iError;
  socklen_t iLen;
  timeval timeout;
  fd_set errorfd;
  fd_set readfd;
  sockaddr_nl addr;
  uint *local_1c0;
  size_t local_1b8;
  long local_1b0 [2];
  ulong local_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_178;
  ulong local_160;
  timeval local_158;
  fd_set local_148;
  fd_set local_c8;
  sockaddr local_40;
  
  uVar2 = socket(0x10,3,0);
  if (uVar2 != 0xffffffff) {
    uVar6 = (ulong)uVar2;
    local_40.sa_family = 0x10;
    local_40.sa_data[0] = '\0';
    local_40.sa_data[1] = '\0';
    local_40.sa_data[2] = '\0';
    local_40.sa_data[3] = '\0';
    local_40.sa_data[4] = '\0';
    local_40.sa_data[5] = '\0';
    local_40.sa_data[6] = '\x11';
    local_40.sa_data[7] = '\x01';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    iVar3 = bind(uVar2,&local_40,0xc);
    if ((iVar3 != -1) && (iVar3 = fcntl(uVar2,2,1), iVar3 != -1)) {
      uVar4 = fcntl(uVar2,3);
      iVar3 = fcntl(uVar2,4,(ulong)(uVar4 | 0x800));
      if ((iVar3 != -1) && (this->m_bStopThread == false)) {
        uVar4 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar4 = uVar2;
        }
        uVar7 = 1L << ((byte)uVar2 & 0x3f);
        iVar3 = (int)uVar4 >> 6;
        __nfds = uVar2 + 1;
        local_1a0 = uVar7;
        local_160 = uVar6;
        do {
          local_158.tv_sec = 2;
          local_158.tv_usec = 0;
          local_c8.fds_bits[0] = 0;
          local_c8.fds_bits[1] = 0;
          local_c8.fds_bits[2] = 0;
          local_c8.fds_bits[3] = 0;
          local_c8.fds_bits[4] = 0;
          local_c8.fds_bits[5] = 0;
          local_c8.fds_bits[6] = 0;
          local_c8.fds_bits[7] = 0;
          local_c8.fds_bits[8] = 0;
          local_c8.fds_bits[9] = 0;
          local_c8.fds_bits[10] = 0;
          local_c8.fds_bits[0xb] = 0;
          local_c8.fds_bits[0xc] = 0;
          local_c8.fds_bits[0xd] = 0;
          local_c8.fds_bits[0xe] = 0;
          local_c8.fds_bits[0xf] = 0;
          local_148.fds_bits[0] = 0;
          local_148.fds_bits[1] = 0;
          local_148.fds_bits[2] = 0;
          local_148.fds_bits[3] = 0;
          local_148.fds_bits[4] = 0;
          local_148.fds_bits[5] = 0;
          local_148.fds_bits[6] = 0;
          local_148.fds_bits[7] = 0;
          local_148.fds_bits[8] = 0;
          local_148.fds_bits[9] = 0;
          local_148.fds_bits[10] = 0;
          local_148.fds_bits[0xb] = 0;
          local_148.fds_bits[0xc] = 0;
          local_148.fds_bits[0xd] = 0;
          local_c8.fds_bits[iVar3] = local_c8.fds_bits[iVar3] | uVar7;
          local_148.fds_bits[0xe] = 0;
          local_148.fds_bits[0xf] = 0;
          local_148.fds_bits[iVar3] = local_148.fds_bits[iVar3] | uVar7;
          iVar5 = select(__nfds,&local_c8,(fd_set *)0x0,&local_148,&local_158);
          bVar1 = true;
          if (0 < iVar5) {
            if ((local_148.fds_bits[iVar3] & uVar7) == 0) {
              if ((local_c8.fds_bits[iVar3] & uVar7) != 0) {
                local_1c0 = (uint *)local_1b0;
                std::__cxx11::string::_M_construct((ulong)&local_1c0,'\0');
                uVar6 = recv((int)uVar6,local_1c0,local_1b8,0);
                puVar8 = local_1c0;
                if (0xf < (int)uVar6) {
                  do {
                    if ((*puVar8 < 0x10) || ((uint)uVar6 < *puVar8)) break;
                    if ((ushort)puVar8[1] - 0x14 < 3) {
                      local_178.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_178.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_178.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_198._M_unused._M_object = (void *)0x0;
                      local_198._8_8_ = 0;
                      local_188 = (code *)0x0;
                      pcStack_180 = (code *)0x0;
                      local_198._M_unused._M_object = operator_new(0x18);
                      *(code **)local_198._M_unused._0_8_ = CbEnumIpAdressen;
                      *(undefined8 *)((long)local_198._M_unused._0_8_ + 8) = 0;
                      *(InitSocket **)((long)local_198._M_unused._0_8_ + 0x10) = this;
                      pcStack_180 = std::
                                    _Function_handler<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*),_std::_Bind<int_(InitSocket::*(InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>_>
                                    ::_M_invoke;
                      local_188 = std::
                                  _Function_handler<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*),_std::_Bind<int_(InitSocket::*(InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>_>
                                  ::_M_manager;
                      BaseSocketImpl::EnumIpAddresses
                                ((function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
                                  *)&local_198,&local_178);
                      if (local_188 != (code *)0x0) {
                        (*local_188)(&local_198,&local_198,__destroy_functor);
                      }
                      NotifyOnAddressChanges(this,&local_178);
                      std::
                      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      ::~vector(&local_178);
                    }
                    else if ((ushort)puVar8[1] == 3) break;
                    uVar2 = *puVar8 + 3 & 0xfffffffc;
                    uVar4 = (uint)uVar6 - uVar2;
                    uVar6 = (ulong)uVar4;
                    puVar8 = (uint *)((long)puVar8 + (ulong)uVar2);
                  } while (0xf < uVar4);
                }
                uVar7 = local_1a0;
                uVar6 = local_160;
                if (local_1c0 != (uint *)local_1b0) {
                  operator_delete(local_1c0,local_1b0[0] + 1);
                  uVar7 = local_1a0;
                  uVar6 = local_160;
                }
              }
            }
            else {
              local_178.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_178.
                                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
              getsockopt((int)uVar6,1,4,&local_1c0,(socklen_t *)&local_178);
              bVar1 = false;
              uVar7 = local_1a0;
            }
          }
          uVar2 = (uint)uVar6;
        } while ((bVar1) && (this->m_bStopThread == false));
      }
    }
    close(uVar2);
  }
  return;
}

Assistant:

void InitSocket::IpChangeThread()
{
    SOCKET fSock;
    if ((fSock = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE)) == -1)
    {
        return;
    }

    struct sockaddr_nl addr{};
    addr.nl_family = AF_NETLINK;
    addr.nl_groups = RTMGRP_LINK | RTMGRP_IPV4_IFADDR | RTMGRP_IPV6_IFADDR;

    if (bind(fSock, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    if (fcntl(fSock, F_SETFD, FD_CLOEXEC) == -1 || fcntl(fSock, F_SETFL, fcntl(fSock, F_GETFL) | O_NONBLOCK) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    while (m_bStopThread == false)
    {
        fd_set readfd, errorfd;
        struct timeval timeout;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(fSock, &readfd);
        FD_SET(fSock, &errorfd);

        if (::select(static_cast<int>(fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(fSock, &errorfd))
            {
                int iError;
                socklen_t iLen = sizeof(iError);
                getsockopt(fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&iError), &iLen);
                break;
            }

            if (FD_ISSET(fSock, &readfd))
            {
                string buf(4096, 0);
                int32_t transferred = ::recv(fSock, &buf[0], buf.size(), 0);

                if (transferred > 0)
                {
                    struct nlmsghdr* nlh = reinterpret_cast<struct nlmsghdr*>(&buf[0]);
                    while ((NLMSG_OK(nlh, static_cast<unsigned int>(transferred))) && (nlh->nlmsg_type != NLMSG_DONE))
                    {
                        if (nlh->nlmsg_type == RTM_NEWADDR || nlh->nlmsg_type == RTM_DELADDR || nlh->nlmsg_type == RTM_GETADDR)
                        {
                            /*struct ifaddrmsg *ifa = (struct ifaddrmsg *) NLMSG_DATA(nlh);
                            struct rtattr *rth = IFA_RTA(ifa);
                            int rtl = IFA_PAYLOAD(nlh);

                            char name[IFNAMSIZ];
                            if_indextoname(ifa->ifa_index, name);
                            */
                            vector<tuple<string, int, int>> vNewIPAddr;
                            BaseSocketImpl::EnumIpAddresses(bind(&InitSocket::CbEnumIpAdressen, this, placeholders::_1, placeholders::_2, placeholders::_3, placeholders::_4), &vNewIPAddr);
                            NotifyOnAddressChanges(vNewIPAddr);
                        }
                        nlh = NLMSG_NEXT(nlh, transferred);
                    }
                }
            }
        }
    }

    ::closesocket(fSock);
}